

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O2

void spell_sleep(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  AFFECT_DATA af;
  
  bVar1 = is_affected_by((CHAR_DATA *)vo,0x11);
  if (!bVar1) {
    bVar1 = is_npc((CHAR_DATA *)vo);
    if (((!bVar1) || ((*(byte *)((long)vo + 0x181) & 0x40) == 0)) &&
       ((int)*(short *)((long)vo + 0x138) <= level + 2)) {
      bVar1 = saves_spell(level + -1,(CHAR_DATA *)vo,0x11);
      if ((!bVar1) && ((*(byte *)((long)vo + 0x1b3) & 4) == 0)) {
        init_affect(&af);
        af.where = 0;
        af.aftype = 0;
        af.level = (short)level;
        af.duration = (short)(level / 4);
        af.location = 0;
        af.modifier = 0;
        af.bitvector[0]._2_1_ = af.bitvector[0]._2_1_ | 2;
        af.mod_name = 7;
        af.type = (short)sn;
        affect_join((CHAR_DATA *)vo,&af);
        bVar1 = is_awake((CHAR_DATA *)vo);
        if (bVar1) {
          send_to_char("You feel very sleepy ..... zzzzzz.\n\r",(CHAR_DATA *)vo);
          act("$n goes to sleep.",(CHAR_DATA *)vo,(void *)0x0,(void *)0x0,0);
          *(undefined2 *)((long)vo + 0x1f8) = 4;
        }
        return;
      }
    }
  }
  act("$N resisted your sleep spell.",ch,(void *)0x0,vo,3);
  return;
}

Assistant:

void spell_sleep(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	AFFECT_DATA af;

	if (is_affected_by(victim, AFF_SLEEP)
		|| (is_npc(victim) && IS_SET(victim->act, ACT_UNDEAD))
		|| (level + 2) < victim->level
		|| saves_spell(level - 1, victim, DAM_CHARM)
		|| IS_SET(victim->imm_flags, IMM_SLEEP))
	{
		act("$N resisted your sleep spell.", ch, 0, victim, TO_CHAR);
		return;
	}

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.aftype = AFT_SPELL;
	af.type = sn;
	af.level = level;
	af.duration = level / 4;
	af.location = APPLY_NONE;
	af.modifier = 0;

	SET_BIT(af.bitvector, AFF_SLEEP);

	af.mod_name = MOD_CONC;
	affect_join(victim, &af);

	if (is_awake(victim))
	{
		send_to_char("You feel very sleepy ..... zzzzzz.\n\r", victim);
		act("$n goes to sleep.", victim, nullptr, nullptr, TO_ROOM);
		victim->position = POS_SLEEPING;
	}
}